

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationDataBuilder::copyContractionsFromBaseCE32
          (CollationDataBuilder *this,UnicodeString *context,UChar32 c,uint32_t ce32,
          ConditionalCE32 *cond,UErrorCode *errorCode)

{
  short sVar1;
  UBool UVar2;
  uint32_t uVar3;
  int32_t index;
  uint uVar4;
  __off_t __length;
  undefined2 *puVar5;
  ConstChar16Ptr local_c0;
  char16_t *local_b8;
  Iterator suffixes;
  
  index = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    puVar5 = (undefined2 *)((ulong)(ce32 >> 0xc & 0xfffffffe) + (long)this->base->contexts);
    if ((ce32 >> 8 & 1) == 0) {
      uVar3 = copyFromBaseCE32(this,c,CONCAT22(*puVar5,puVar5[1]),'\x01',errorCode);
      index = addConditionalCE32(this,context,uVar3,errorCode);
      cond->next = index;
      if (U_ZERO_ERROR < *errorCode) {
        return 0;
      }
      cond = (ConditionalCE32 *)UVector::elementAt(&this->conditionalCE32s,index);
    }
    else {
      index = -1;
    }
    sVar1 = (context->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar4 = (context->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)sVar1 >> 5;
    }
    local_c0.p_ = puVar5 + 2;
    UCharsTrie::Iterator::Iterator(&suffixes,&local_c0,0,errorCode);
    local_b8 = local_c0.p_;
    while (UVar2 = UCharsTrie::Iterator::next(&suffixes,errorCode), UVar2 != '\0') {
      UnicodeString::append(context,&suffixes.str_);
      uVar3 = copyFromBaseCE32(this,c,suffixes.value_,'\x01',errorCode);
      index = addConditionalCE32(this,context,uVar3,errorCode);
      cond->next = index;
      if (U_ZERO_ERROR < *errorCode) {
        index = 0;
        break;
      }
      cond = (ConditionalCE32 *)UVector::elementAt(&this->conditionalCE32s,index);
      UnicodeString::truncate(context,(char *)(ulong)uVar4,__length);
    }
    UCharsTrie::Iterator::~Iterator(&suffixes);
  }
  return index;
}

Assistant:

int32_t
CollationDataBuilder::copyContractionsFromBaseCE32(UnicodeString &context, UChar32 c, uint32_t ce32,
                                                   ConditionalCE32 *cond, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
    int32_t index;
    if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
        // No match on the single code point.
        // We are underneath a prefix, and the default mapping is just
        // a fallback to the mappings for a shorter prefix.
        U_ASSERT(context.length() > 1);
        index = -1;
    } else {
        ce32 = CollationData::readCE32(p);  // Default if no suffix match.
        U_ASSERT(!Collation::isContractionCE32(ce32));
        ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        cond = getConditionalCE32(index);
    }

    int32_t suffixStart = context.length();
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        context.append(suffixes.getString());
        ce32 = copyFromBaseCE32(c, (uint32_t)suffixes.getValue(), TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        // No need to update the unsafeBackwardSet because the tailoring set
        // is already a copy of the base set.
        cond = getConditionalCE32(index);
        context.truncate(suffixStart);
    }
    U_ASSERT(index >= 0);
    return index;
}